

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O2

bool loadBackgroundProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  char buf [1024];
  
  program = djgp_create();
  fwrite("Loading {Background-Program}\n",0x1d,1,_stdout);
  fflush(_stdout);
  djgp_push_string(program,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  strcat2(buf,g_app.dir.shader,"background.glsl");
  djgp_push_file(program,buf);
  bVar1 = djgp_to_gl(program,0x1ae,false,true,g_gl.programs + 1);
  if (bVar1) {
    djgp_release(program);
    g_gl.uniforms[4] = (*glad_glGetUniformLocation)(g_gl.programs[1],"u_ClearColor");
    g_gl.uniforms[5] = (*glad_glGetUniformLocation)(g_gl.programs[1],"u_EnvmapSampler");
    configureBackgroundProgram();
    GVar2 = (*glad_glGetError)();
    bVar1 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    djgp_release(program);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool loadBackgroundProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_BACKGROUND];
    char buf[1024];

    LOG("Loading {Background-Program}\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "background.glsl"));
    if (!djgp_to_gl(djp, 430, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_BACKGROUND_CLEAR_COLOR] =
        glGetUniformLocation(g_gl.programs[PROGRAM_BACKGROUND], "u_ClearColor");
    g_gl.uniforms[UNIFORM_BACKGROUND_ENVMAP_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_BACKGROUND], "u_EnvmapSampler");

    configureBackgroundProgram();

    return (glGetError() == GL_NO_ERROR);
}